

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__depth_target____fx_depthtarget_common
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *buffer;
  bool bVar1;
  undefined8 in_RAX;
  uint64 *puVar2;
  code *pcVar3;
  StringHash SVar4;
  uint64 uVar5;
  long lVar6;
  xmlChar **ppxVar7;
  bool failed_2;
  bool failed_1;
  bool failed;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  puVar2 = (uint64 *)
           GeneratedSaxParser::StackMemoryManager::newObject
                     (&(this->
                       super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                       ).super_ParserTemplateBase.mStackMemoryManager,0x20);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  *attributeDataPtr = puVar2;
  ppxVar7 = attributes->attributes;
  if (ppxVar7 != (xmlChar **)0x0) {
    text = *ppxVar7;
    while (text != (ParserChar *)0x0) {
      pcVar3 = (code *)GeneratedSaxParser::Utils::calculateStringHash(text);
      buffer = ppxVar7[1];
      if ((long)pcVar3 < 0x704ac8) {
        if (pcVar3 == (code *)0x7400) {
          uVar5 = GeneratedSaxParser::Utils::toUint64(buffer,(bool *)((long)&uStack_38 + 5));
          puVar2[2] = uVar5;
          if (uStack_38._5_1_ != '\x01') goto LAB_006a468c;
          pcVar3 = (code *)0x7400;
LAB_006a4676:
          bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0x4f724,(StringHash)pcVar3,buffer);
        }
        else {
          if (pcVar3 == (code *)0x6c795) {
            SVar4 = GeneratedSaxParser::Utils::calculateStringHash
                              (buffer,(bool *)((long)&uStack_38 + 6));
            lVar6 = 8;
            do {
              if (*(StringHash *)(&UNK_0083a2d8 + lVar6) == SVar4) {
                *(undefined4 *)(puVar2 + 1) =
                     *(undefined4 *)((long)&ENUM__fx_surface_face_enumMap + lVar6);
                goto LAB_006a468c;
              }
              lVar6 = lVar6 + 0x10;
            } while (lVar6 != 0x68);
            uStack_38._0_7_ = CONCAT16(1,(undefined6)uStack_38);
            *(undefined4 *)(puVar2 + 1) = 6;
            pcVar3 = (code *)0x6c795;
            goto LAB_006a4676;
          }
LAB_006a4612:
          bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_UNKNOWN_ATTRIBUTE,0x4f724,text,buffer);
        }
        if (bVar1 != false) {
          return false;
        }
      }
      else if (pcVar3 == (code *)0x7a2f95) {
        uVar5 = GeneratedSaxParser::Utils::toUint64(buffer,(bool *)((long)&uStack_38 + 4));
        puVar2[3] = uVar5;
        if (uStack_38._4_1_ == '\x01') {
          pcVar3 = (code *)0x7a2f95;
          goto LAB_006a4676;
        }
      }
      else {
        if (pcVar3 != COLLADASaxFWL15::ColladaParserAutoGen15Private::
                      _end__render__instance_material) goto LAB_006a4612;
        uVar5 = GeneratedSaxParser::Utils::toUint64(buffer,(bool *)((long)&uStack_38 + 7));
        *puVar2 = uVar5;
        if (uStack_38._7_1_ == '\x01') {
          pcVar3 = COLLADASaxFWL15::ColladaParserAutoGen15Private::_end__render__instance_material;
          goto LAB_006a4676;
        }
      }
LAB_006a468c:
      ppxVar7 = ppxVar7 + 2;
      text = *ppxVar7;
    }
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__depth_target____fx_depthtarget_common( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__depth_target____fx_depthtarget_common( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

depth_target____fx_depthtarget_common__AttributeData* attributeData = newData<depth_target____fx_depthtarget_common__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_index:
    {
bool failed;
attributeData->index = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_DEPTH_TARGET,
        HASH_ATTRIBUTE_index,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_face:
    {
bool failed;
attributeData->face = Utils::toEnum<ENUM__fx_surface_face_enum, StringHash, ENUM__fx_surface_face_enum__COUNT>(attributeValue, failed, ENUM__fx_surface_face_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_DEPTH_TARGET,
        HASH_ATTRIBUTE_face,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_mip:
    {
bool failed;
attributeData->mip = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_DEPTH_TARGET,
        HASH_ATTRIBUTE_mip,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_slice:
    {
bool failed;
attributeData->slice = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_DEPTH_TARGET,
        HASH_ATTRIBUTE_slice,
        attributeValue))
{
    return false;
}

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_DEPTH_TARGET, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}